

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathOp.cpp
# Opt level: O3

void __thiscall MathOp::Mod2m::forward(Mod2m *this)

{
  int *piVar1;
  bool bVar2;
  Mat *this_00;
  BitLT *this_01;
  long lVar3;
  long lVar4;
  Mat local_e0;
  Mat local_b8;
  Mat local_90;
  Mat local_68;
  long local_38;
  long local_30;
  undefined8 local_28;
  undefined8 local_20;
  
  Op::reinit(&this->super_Op);
  switch((this->super_Op).forwardRound) {
  case 2:
    local_28 = 0x40000000000000;
    local_20 = 0;
    Mat::operator+(&local_b8,this->a,(ll128 *)&local_28);
    local_38 = 1L << ((byte)this->m & 0x3f);
    local_30 = local_38 >> 0x3f;
    Mat::operator*(&local_68,this->r_nd,(ll128 *)&local_38);
    Mat::operator+(&local_90,&local_b8,&local_68);
    Mat::operator+(&local_e0,&local_90,this->r_st);
    Mat::operator=(this->b,&local_e0);
    Mat::~Mat(&local_e0);
    Mat::~Mat(&local_90);
    Mat::~Mat(&local_68);
    this_00 = &local_b8;
    break;
  case 3:
    (**(this->pRevealD->super_Op)._vptr_Op)();
    this_01 = (BitLT *)this->pRevealD;
    goto LAB_00113f3a;
  case 4:
    Mat::mod(&local_e0,this->b,1L << ((byte)this->m & 0x3f));
    Mat::operator=(this->b,&local_e0);
    this_00 = &local_e0;
    break;
  case 5:
    (**(this->pBitLT->super_Op)._vptr_Op)();
    this_01 = this->pBitLT;
LAB_00113f3a:
    bVar2 = Op::forwardHasNext(&this_01->super_Op);
    if (!bVar2) {
      return;
    }
    piVar1 = &(this->super_Op).forwardRound;
    *piVar1 = *piVar1 + -1;
    return;
  case 6:
    Mat::operator-(&local_90,this->b,this->r_st);
    local_68._0_8_ = 1L << ((byte)this->m & 0x3f);
    local_68._8_8_ = (long)local_68._0_8_ >> 0x3f;
    Mat::operator*(&local_b8,this->u,(ll128 *)&local_68);
    Mat::operator+(&local_e0,&local_90,&local_b8);
    Mat::operator=(this->res,&local_e0);
    Mat::~Mat(&local_e0);
    Mat::~Mat(&local_b8);
    Mat::~Mat(&local_90);
    Mat::clear(this->r_nd);
    Mat::clear(this->r_st);
    if (0 < this->m) {
      lVar3 = 0;
      lVar4 = 0;
      do {
        Mat::clear((Mat *)((long)&this->r_B->r + lVar3));
        lVar4 = lVar4 + 1;
        lVar3 = lVar3 + 0x28;
      } while (lVar4 < this->m);
    }
    Mat::clear(this->u);
    Mat::clear(this->b);
  default:
    goto switchD_00113d5f_default;
  }
  Mat::~Mat(this_00);
switchD_00113d5f_default:
  return;
}

Assistant:

void MathOp::Mod2m::forward() {
    reinit();
    switch (forwardRound) {
        case 1:
//            r_nd->clear();
//            r_st->clear();
//            for (int i = 0; i < m; i++) {
//                r_B[i].clear();
//            }
//            u->clear();
//            b->clear();
            // pRandM->forward();
            // if (pRandM->forwardHasNext()) {
            //     forwardRound--;
            // }
            break;
        case 2:
            // todo: m+r > q 的问题
            *b = *a + (1ll << (BIT_P_LEN - 1)) + (*r_nd) * (1ll << m) + (*r_st);
            break;
        case 3:
            pRevealD->forward();
            if (pRevealD->forwardHasNext()) {
                forwardRound--;
            }
            break;
        case 4:
//            cout << "Test Mod2m\n";
//            b->print();
            *b = b->mod(1ll << m);
//            b->print();
            break;
        case 5:
            pBitLT->forward();
            if (pBitLT->forwardHasNext()) {
                forwardRound--;
            }
            break;
        case 6:
            *res = *b - (*r_st) + (*u) * (1ll << m);
            r_nd->clear();
            r_st->clear();
            for (int i = 0; i < m; i++) {
                r_B[i].clear();
            }
            u->clear();
            b->clear();
            break;
    }
}